

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_search(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  int iVar1;
  code *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int cmp;
  avl_node *p;
  avl_node *local_28;
  
  local_28 = (avl_node *)*in_RDI;
  while( true ) {
    while( true ) {
      if (local_28 == (avl_node *)0x0) {
        return (avl_node *)0x0;
      }
      iVar1 = (*in_RDX)(local_28,in_RSI,in_RDI[1]);
      if (iVar1 < 1) break;
      local_28 = local_28->left;
    }
    if (-1 < iVar1) break;
    local_28 = local_28->right;
  }
  return local_28;
}

Assistant:

struct avl_node* avl_search(struct avl_tree *tree,
                            struct avl_node *node,
                            avl_cmp_func *func)
// exact match
{
    struct avl_node *p = tree->root;
    int cmp;

    while(p)
    {
        cmp = func(p, node, tree->aux);
        if (cmp > 0) {
            p = p->left;
        }else if (cmp < 0){
            p = p->right;
        }else {
            // search success
            return p;
        }
    }
    // search fail
    return NULL;
}